

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core_write.cpp
# Opt level: O0

UniValue * ValueFromAmount(CAmount amount)

{
  char **in_RSI;
  UniValue *in_RDI;
  long in_FS_OFFSET;
  int64_t remainder;
  int64_t quotient;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  string *str;
  UniValue *this;
  long *in_stack_ffffffffffffffa0;
  long *in_stack_ffffffffffffffa8;
  string local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  str = &local_28;
  this = in_RDI;
  tinyformat::format<char_const*,long,long>
            ((char *)in_RDI,in_RSI,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  UniValue::UniValue(this,(VType)((ulong)in_RDI >> 0x20),str);
  std::__cxx11::string::~string(in_stack_ffffffffffffff78);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return this;
}

Assistant:

UniValue ValueFromAmount(const CAmount amount)
{
    static_assert(COIN > 1);
    int64_t quotient = amount / COIN;
    int64_t remainder = amount % COIN;
    if (amount < 0) {
        quotient = -quotient;
        remainder = -remainder;
    }
    return UniValue(UniValue::VNUM,
            strprintf("%s%d.%08d", amount < 0 ? "-" : "", quotient, remainder));
}